

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddress.cpp
# Opt level: O2

void __thiscall CSubNet::CSubNet(CSubNet *this,CNetAddr *addr,uint8_t mask)

{
  Network NVar1;
  uint uVar2;
  long lVar3;
  uint uVar4;
  long lVar5;
  CSubNet *pCVar6;
  ulong uVar7;
  byte bVar8;
  byte bVar9;
  long in_FS_OFFSET;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  CSubNet(this);
  NVar1 = addr->m_net;
  if (mask < 0x21 && NVar1 == NET_IPV4) {
    this->valid = true;
  }
  else {
    this->valid = mask < 0x81 && NVar1 == NET_IPV6;
    if (mask >= 0x81 || NVar1 != NET_IPV6) goto LAB_00a84c4c;
  }
  CNetAddr::operator=(&this->network,addr);
  lVar5 = 0;
  uVar7 = 0;
  while( true ) {
    uVar2 = (this->network).m_addr._size;
    uVar4 = uVar2 - 0x11;
    if (uVar2 < 0x11) {
      uVar4 = uVar2;
    }
    if (uVar4 <= uVar7) break;
    bVar8 = mask;
    if (7 < mask) {
      bVar8 = 8;
    }
    bVar9 = (byte)(0xff << (8 - bVar8 & 0x1f));
    this->netmask[uVar7] = bVar9;
    pCVar6 = this;
    if (0x10 < uVar2) {
      pCVar6 = (CSubNet *)(this->network).m_addr._union.indirect_contents.indirect;
    }
    pCVar6->netmask[(lVar5 >> 0x20) + -0x20] = pCVar6->netmask[(lVar5 >> 0x20) + -0x20] & bVar9;
    mask = mask - bVar8;
    uVar7 = uVar7 + 1;
    lVar5 = lVar5 + 0x100000000;
  }
LAB_00a84c4c:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

CSubNet::CSubNet(const CNetAddr& addr, uint8_t mask) : CSubNet()
{
    valid = (addr.IsIPv4() && mask <= ADDR_IPV4_SIZE * 8) ||
            (addr.IsIPv6() && mask <= ADDR_IPV6_SIZE * 8);
    if (!valid) {
        return;
    }

    assert(mask <= sizeof(netmask) * 8);

    network = addr;

    uint8_t n = mask;
    for (size_t i = 0; i < network.m_addr.size(); ++i) {
        const uint8_t bits = n < 8 ? n : 8;
        netmask[i] = (uint8_t)((uint8_t)0xFF << (8 - bits)); // Set first bits.
        network.m_addr[i] &= netmask[i]; // Normalize network according to netmask.
        n -= bits;
    }
}